

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int linux_kevent_copyout(kqueue *kq,int nready,kevent *el,int nevents)

{
  int iVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  kevent *pkVar10;
  kevent *pkVar11;
  epoll_event *ev;
  ushort *puVar12;
  
  pkVar11 = el;
  if (0 < nready) {
    uVar9 = (ulong)(uint)nready;
    pkVar10 = el + nevents;
    lVar5 = __tls_get_addr(&PTR_0010bfd0);
    puVar12 = (ushort *)(lVar5 + 0x1930);
    do {
      plVar2 = *(long **)(puVar12 + 2);
      if (plVar2 == (long *)0x0) {
        uVar4 = 4;
      }
      else {
        iVar1 = (int)plVar2[1];
        if (iVar1 == 3) {
          uVar4 = (**(code **)(*(long *)(*plVar2 + 8) + 0x30))
                            (pkVar11,(ulong)((long)pkVar10 - (long)pkVar11) >> 5,
                             *(long *)(*plVar2 + 8),0,puVar12);
          if ((-1 < (int)uVar4) && (pkVar11->filter == 0)) {
            uVar4 = 0;
          }
          uVar6 = 0;
          if (-1 < (int)uVar4) {
            uVar6 = (ulong)uVar4;
          }
          pkVar11 = pkVar11 + uVar6;
          if ((int)uVar4 < 0) {
            uVar4 = uVar4 >> 0x1e | 5;
          }
          else {
LAB_001047b7:
            uVar4 = 0;
          }
        }
        else if (iVar1 == 2) {
          lVar5 = *(long *)(*plVar2 + 0x28);
          lVar7 = *(long *)(*plVar2 + 0x30);
          if ((lVar5 == 0) || ((*puVar12 & 0x2019) == 0)) {
LAB_001046e3:
            uVar4 = 0;
            if ((lVar7 != 0) && ((*puVar12 & 0x1c) != 0)) {
              if (pkVar11 < pkVar10) {
                lVar5 = *(long *)(lVar7 + 0x28) + ~(long)*(short *)(lVar7 + 8) * 0xa0;
                uVar4 = (**(code **)(lVar5 + 0x48))
                                  (pkVar11,(ulong)((long)pkVar10 - (long)pkVar11) >> 5,lVar5 + 0x18,
                                   lVar7,puVar12);
                if ((-1 < (int)uVar4) && (pkVar11->filter == 0)) {
                  uVar4 = 0;
                }
                if ((int)uVar4 < 0) goto LAB_001047a2;
                pkVar11 = pkVar11 + uVar4;
                uVar4 = 0;
              }
              else {
                uVar4 = 6;
              }
            }
          }
          else {
            uVar4 = 6;
            if (pkVar11 < pkVar10) {
              lVar8 = ~(long)*(short *)(lVar5 + 8) * 0xa0 + *(long *)(lVar5 + 0x28);
              uVar4 = (**(code **)(lVar8 + 0x48))
                                (pkVar11,(ulong)((long)pkVar10 - (long)pkVar11) >> 5,lVar8 + 0x18,
                                 lVar5,puVar12);
              if ((-1 < (int)uVar4) && (pkVar11->filter == 0)) {
                uVar4 = 0;
              }
              if (-1 < (int)uVar4) {
                pkVar11 = pkVar11 + uVar4;
                goto LAB_001046e3;
              }
LAB_001047a2:
              uVar4 = 7;
            }
          }
          if (uVar4 == 0) goto LAB_001047b7;
          if (uVar4 == 6) {
            uVar4 = 7;
          }
        }
        else {
          uVar4 = 1;
          if ((iVar1 == 1) && (uVar4 = 7, pkVar11 < pkVar10)) {
            lVar5 = *plVar2;
            lVar7 = ~(long)*(short *)(lVar5 + 8) * 0xa0 + *(long *)(lVar5 + 0x28);
            uVar3 = (**(code **)(lVar7 + 0x48))
                              (pkVar11,(ulong)((long)pkVar10 - (long)pkVar11) >> 5,lVar7 + 0x18,
                               lVar5,puVar12);
            if ((-1 < (int)uVar3) && (pkVar11->filter == 0)) {
              uVar3 = 0;
            }
            if (-1 < (int)uVar3) {
              pkVar11 = pkVar11 + uVar3;
              goto LAB_001047b7;
            }
          }
        }
      }
      if ((uVar4 != 0) && (uVar4 != 4)) {
        if (uVar4 != 7) {
          return -1;
        }
        break;
      }
      puVar12 = puVar12 + 6;
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  return (int)((ulong)((long)pkVar11 - (long)el) >> 5);
}

Assistant:

int
linux_kevent_copyout(struct kqueue *kq, int nready, struct kevent *el, int nevents)
{
    struct kevent   *el_p = el, *el_end = el + nevents;
    int             i;

    dbg_printf("got %i events from epoll", nready);

    for (i = 0; i < nready; i++) {
        struct epoll_event    *ev = &epoll_events[i];    /* Thread local storage populated in linux_kevent_wait */
        struct epoll_udata    *epoll_udata = ev->data.ptr;
        int                   rv;

        if (!epoll_udata) {
            dbg_puts("event has no knote, skipping..."); /* Forgot to call KN_UDATA()? */
            continue;
        }

        dbg_printf("[%i] %s", i, epoll_event_dump(ev));

        /*
         * epoll event is associated with a single filter
         * so we just have one knote per event.
         *
         * As different filters store pointers to different
         * structures, we need to examine ud_type to figure
         * out what epoll_data contains.
         */
        switch (epoll_udata->ud_type) {
        case EPOLL_UDATA_KNOTE:
        {
            struct knote *kn = epoll_udata->ud_kn;

            assert(kn);
            if (el_p >= el_end) {
            oos:
                dbg_printf("no more available kevent slots, used %zu", el_p - el);
                goto done;
            }

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
            if (rv < 0) goto done;
            el_p += rv;
        }
            break;

        /*
         * epoll event is associated with one filter for
         * reading and one filter for writing.
         */
        case EPOLL_UDATA_FD_STATE:
        {
            struct fd_state   *fds = epoll_udata->ud_fds;
            struct knote      *kn, *write;
            assert(fds);

            /*
             * fds can be freed after the first linux_kevent_copyout_ev
             * so cache the pointer value here.
             */
            write = fds->fds_write;

            /*
             *    FD, or errored, or other side shutdown
             */
            if ((kn = fds->fds_read) && (ev->events & (EPOLLIN | EPOLLHUP | EPOLLRDHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }

            /*
             *    FD is writable, or errored, or other side shutdown
             */
            if ((kn = write) && (ev->events & (EPOLLOUT | POLLHUP | EPOLLERR))) {
                if (el_p >= el_end) goto oos;

                rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, knote_get_filter(kn), kn);
                if (rv < 0) goto done;
                el_p += rv;
            }
        }
            break;

        case EPOLL_UDATA_EVENT_FD:
        {
            struct eventfd    *efd = epoll_udata->ud_efd;

            assert(efd);

            rv = linux_kevent_copyout_ev(el_p, (el_end - el_p), ev, efd->ef_filt, NULL);
            if (rv < 0) goto done;
            el_p += rv;
            break;
        }

        /*
         *    Bad udata value. Maybe use after free?
         */
        default:
            assert(0);
            return (-1);
        }
    }

done:
    return el_p - el;
}